

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::ContinuousAssignSymbol::ContinuousAssignSymbol
          (ContinuousAssignSymbol *this,ExpressionSyntax *syntax)

{
  SourceLocation SVar1;
  Token local_20;
  
  local_20 = slang::syntax::SyntaxNode::getFirstToken(&syntax->super_SyntaxNode);
  SVar1 = parsing::Token::location(&local_20);
  (this->super_Symbol).kind = ContinuousAssign;
  (this->super_Symbol).name._M_len = 0;
  (this->super_Symbol).name._M_str = "";
  (this->super_Symbol).location = SVar1;
  (this->super_Symbol).indexInScope = 0;
  (this->super_Symbol).parentScope = (Scope *)0x0;
  (this->super_Symbol).nextInScope = (Symbol *)0x0;
  this->assign = (Expression *)0x0;
  (this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>._M_payload.
  super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_engaged = false;
  (this->super_Symbol).originatingSyntax = &syntax->super_SyntaxNode;
  return;
}

Assistant:

ContinuousAssignSymbol::ContinuousAssignSymbol(const ExpressionSyntax& syntax) :
    Symbol(SymbolKind::ContinuousAssign, "", syntax.getFirstToken().location()) {

    setSyntax(syntax);
}